

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseAssembler::embedDataArray
          (BaseAssembler *this,TypeId typeId,void *data,size_t itemCount,size_t repeatCount)

{
  long in_RCX;
  byte in_SIL;
  BaseAssembler *in_RDI;
  StringTmp<512UL> *in_R8;
  StringTmp<512UL> sb;
  size_t i;
  Error _err;
  CodeWriter writer;
  size_t totalSize;
  size_t dataSize;
  FastUInt8 of;
  uint32_t typeSize;
  TypeId finalTypeId;
  uint32_t deabstractDelta;
  FastUInt8 *in_stack_fffffffffffffc20;
  String *in_stack_fffffffffffffc28;
  BaseAssembler *in_stack_fffffffffffffc30;
  CodeWriter *in_stack_fffffffffffffc38;
  BaseAssembler *in_stack_fffffffffffffc40;
  StringTmp<512UL> *this_00;
  String *in_stack_fffffffffffffc48;
  byte local_3a1;
  bool local_391;
  StringTmp<512UL> local_390;
  undefined1 auStack_38f [7];
  ulong local_388;
  undefined1 *local_378;
  size_t in_stack_fffffffffffffcb0;
  StringTmp<512UL> *local_168;
  CodeWriter local_158;
  unsigned_long local_150;
  ulong local_148;
  unsigned_long local_140;
  char local_135;
  uint local_134;
  byte local_12d;
  undefined4 local_12c;
  StringTmp<512UL> *local_128;
  Error local_fc;
  StringTmp<512UL> *local_f8;
  Logger *local_f0;
  undefined1 local_d9;
  StringTmp<512UL> *local_d8;
  StringTmp<512UL> *local_d0;
  Logger *local_c8;
  uint local_bc;
  undefined4 local_b0;
  byte local_aa;
  byte local_a9;
  FormatOptions *local_a8;
  Environment *local_90;
  StringTmp<512UL> *local_88;
  StringTmp<512UL> *local_80;
  StringTmp<512UL> *local_78;
  StringTmp<512UL> *local_70;
  Environment *local_68;
  Arch local_5b;
  Arch local_5a;
  undefined4 local_58;
  undefined4 local_54;
  uint local_50;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined4 local_48;
  undefined4 local_44;
  uint local_40;
  undefined1 local_3b;
  undefined1 local_3a;
  byte local_39;
  undefined4 *local_38;
  undefined4 *local_30;
  uint *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  uint *local_10;
  StringTmp<512UL> *local_8;
  
  local_68 = &(in_RDI->super_BaseEmitter)._environment;
  local_5b = local_68->_arch;
  local_bc = 8;
  if ((local_5b & k32BitMask) == k32BitMask) {
    local_bc = 4;
  }
  local_12c = 6;
  if (7 < local_bc) {
    local_12c = 8;
  }
  local_4a = 0x20;
  local_4b = 0x21;
  local_50 = (uint)in_SIL;
  local_54 = 0x20;
  local_58 = 0x21;
  local_10 = &local_50;
  local_18 = &local_54;
  local_20 = &local_58;
  local_391 = 0x1f < local_50 && local_50 < 0x22;
  local_3a1 = in_SIL;
  if (local_391) {
    local_3a1 = in_SIL + (char)local_12c;
  }
  local_12d = local_3a1;
  local_aa = local_3a1;
  local_39 = local_3a1;
  local_3a = 0x20;
  local_3b = 100;
  local_40 = (uint)local_3a1;
  local_44 = 0x20;
  local_48 = 100;
  local_28 = &local_40;
  local_30 = &local_44;
  local_38 = &local_48;
  local_b0 = local_12c;
  local_5a = local_5b;
  if (local_40 < 0x20 || 100 < local_40) {
    DebugUtils::errored(2);
    local_fc = BaseEmitter::reportError
                         (&in_stack_fffffffffffffc30->super_BaseEmitter,
                          (Error)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                          (char *)in_stack_fffffffffffffc20);
  }
  else if ((in_RCX == 0) || (in_R8 == (StringTmp<512UL> *)0x0)) {
    local_fc = 0;
  }
  else {
    local_a9 = local_3a1;
    local_134 = (uint)(byte)TypeUtils::_typeData[(ulong)local_3a1 + 0x100];
    local_135 = '\0';
    local_148 = (ulong)local_134;
    local_128 = in_R8;
    local_140 = Support::mulOverflow<unsigned_long>
                          ((unsigned_long *)in_stack_fffffffffffffc30,
                           (unsigned_long *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    local_150 = Support::mulOverflow<unsigned_long>
                          ((unsigned_long *)in_stack_fffffffffffffc30,
                           (unsigned_long *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    if (local_135 == '\0') {
      CodeWriter::CodeWriter(&local_158,in_RDI);
      local_fc = CodeWriter::ensureSpace
                           ((CodeWriter *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                            (size_t)in_stack_fffffffffffffc38);
      if (local_fc == 0) {
        for (local_168 = (StringTmp<512UL> *)0x0; local_168 < local_128; local_168 = local_168 + 1)
        {
          CodeWriter::emitData
                    ((CodeWriter *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                     (size_t)in_stack_fffffffffffffc20);
        }
        CodeWriter::done(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
        if ((in_RDI->super_BaseEmitter)._logger != (Logger *)0x0) {
          this_00 = &local_390;
          local_f8 = this_00;
          local_8 = this_00;
          memset(this_00,0,0x20);
          StringTmp<512UL>::_resetToTemporary(this_00);
          local_f0 = (in_RDI->super_BaseEmitter)._logger;
          local_a8 = &local_f0->_options;
          local_90 = &(in_RDI->super_BaseEmitter)._environment;
          Formatter::formatData
                    (in_stack_fffffffffffffc48,(FormatFlags)((ulong)this_00 >> 0x20),
                     (Arch)((ulong)this_00 >> 0x18),(TypeId)((ulong)this_00 >> 0x10),
                     in_stack_fffffffffffffc38,(size_t)in_stack_fffffffffffffc30,
                     in_stack_fffffffffffffcb0);
          local_d8 = &local_390;
          local_d9 = 10;
          String::_opChar(in_stack_fffffffffffffc28,
                          (ModifyOp)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                          (char)((ulong)in_stack_fffffffffffffc20 >> 0x18));
          local_c8 = (in_RDI->super_BaseEmitter)._logger;
          local_d0 = &local_390;
          if ((byte)local_390 < 0x1f) {
            local_378 = auStack_38f;
            local_388 = (ulong)(byte)local_390;
          }
          local_88 = local_d0;
          local_80 = local_d0;
          local_78 = local_d0;
          local_70 = local_d0;
          (*local_c8->_vptr_Logger[2])(local_c8,local_378,local_388);
          StringTmp<512UL>::~StringTmp(local_128);
        }
        local_fc = 0;
      }
    }
    else {
      DebugUtils::errored(1);
      local_fc = BaseEmitter::reportError
                           (&in_stack_fffffffffffffc30->super_BaseEmitter,
                            (Error)((ulong)in_stack_fffffffffffffc28 >> 0x20),
                            (char *)in_stack_fffffffffffffc20);
    }
  }
  return local_fc;
}

Assistant:

Error BaseAssembler::embedDataArray(TypeId typeId, const void* data, size_t itemCount, size_t repeatCount) {
  uint32_t deabstractDelta = TypeUtils::deabstractDeltaOfSize(registerSize());
  TypeId finalTypeId = TypeUtils::deabstract(typeId, deabstractDelta);

  if (ASMJIT_UNLIKELY(!TypeUtils::isValid(finalTypeId)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (itemCount == 0 || repeatCount == 0)
    return kErrorOk;

  uint32_t typeSize = TypeUtils::sizeOf(finalTypeId);
  Support::FastUInt8 of = 0;

  size_t dataSize = Support::mulOverflow(itemCount, size_t(typeSize), &of);
  size_t totalSize = Support::mulOverflow(dataSize, repeatCount, &of);

  if (ASMJIT_UNLIKELY(of))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, totalSize));

  for (size_t i = 0; i < repeatCount; i++)
    writer.emitData(data, dataSize);

  writer.done(this);

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<512> sb;
    Formatter::formatData(sb, _logger->flags(), arch(), typeId, data, itemCount, repeatCount);
    sb.append('\n');
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}